

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O3

void __thiscall
wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::JumpThreader::redirectBranches(wasm::
Block*,wasm::Name_(void *this,Block *from,Name to)

{
  pointer ppEVar1;
  iterator __position;
  anon_class_24_3_17062666 func;
  mapped_type *pmVar2;
  vector<wasm::Expression*,std::allocator<wasm::Expression*>> *this_00;
  pointer ppEVar3;
  Expression local_a0;
  Expression local_90;
  undefined1 local_80 [8];
  Name to_local;
  Expression *pEStack_50;
  Expression *branch;
  bool *local_40;
  bool local_31 [8];
  bool worked;
  
  to_local.super_IString.str._M_len = to.super_IString.str._M_str;
  local_80 = (undefined1  [8])to.super_IString.str._M_len;
  to_local.super_IString.str._M_str = (char *)to_local.super_IString.str._M_len;
  pmVar2 = std::__detail::
           _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)((long)this + 0xd8),&from->name);
  ppEVar3 = (pmVar2->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppEVar1 = (pmVar2->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar3 != ppEVar1) {
    do {
      local_a0._0_8_ = (from->name).super_IString.str._M_len;
      local_a0.type.id = (uintptr_t)(from->name).super_IString.str._M_str;
      local_90.type.id = (uintptr_t)to_local.super_IString.str._M_str;
      local_31[0] = false;
      pEStack_50 = &local_a0;
      branch = &local_90;
      func.to = (Name *)branch;
      func.from = (Name *)pEStack_50;
      func.worked = local_31;
      local_90._0_8_ = to.super_IString.str._M_len;
      local_40 = local_31;
      BranchUtils::
      operateOnScopeNameUses<wasm::BranchUtils::replacePossibleTarget(wasm::Expression*,wasm::Name,wasm::Name)::_lambda(wasm::Name&)_1_>
                (*ppEVar3,func);
      if (local_31[0] == true) {
        *(undefined1 *)((long)this + 0x110) = 1;
      }
      ppEVar3 = ppEVar3 + 1;
    } while (ppEVar3 != ppEVar1);
    ppEVar3 = (pmVar2->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppEVar1 = (pmVar2->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppEVar3 != ppEVar1) {
      do {
        pEStack_50 = *ppEVar3;
        this_00 = (vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                  std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)((long)this + 0xd8),(key_type *)local_80);
        __position._M_current = *(Expression ***)(this_00 + 8);
        if (__position._M_current == *(Expression ***)(this_00 + 0x10)) {
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          _M_realloc_insert<wasm::Expression*const&>(this_00,__position,&pEStack_50);
        }
        else {
          *__position._M_current = pEStack_50;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
        ppEVar3 = ppEVar3 + 1;
      } while (ppEVar3 != ppEVar1);
    }
  }
  return;
}

Assistant:

void redirectBranches(Block* from, Name to) {
        auto& branches = labelToBranches[from->name];
        for (auto* branch : branches) {
          if (BranchUtils::replacePossibleTarget(branch, from->name, to)) {
            worked = true;
          }
        }
        // if the jump is to another block then we can update the list, and
        // maybe push it even more later
        for (auto* branch : branches) {
          labelToBranches[to].push_back(branch);
        }
      }